

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O1

bool testMethod_substr_AtStart(String *str)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  String substr;
  String SStack_38;
  
  cm::String::substr(&SStack_38,str,0,2);
  if (SStack_38.view_._M_str == (str->view_)._M_str) {
    if (SStack_38.view_._M_len != 2) {
      iVar2 = 0x330;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.size() == 2) failed on line ",0x2f);
      goto LAB_0018f96f;
    }
    pcVar5 = cm::String::c_str(&SStack_38);
    iVar2 = strcmp(pcVar5,"ab");
    if (iVar2 != 0) {
      iVar2 = 0x334;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(std::strcmp(substr_c, \"ab\") == 0) failed on line ",0x3d);
LAB_0018f92e:
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      goto LAB_0018f991;
    }
    pcVar6 = (str->view_)._M_str;
    if (pcVar5 == pcVar6) {
      iVar2 = 0x335;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr_c != str.data()) failed on line ",0x33);
      goto LAB_0018f92e;
    }
    if (SStack_38.view_._M_str == pcVar6) {
      iVar2 = 0x336;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.data() != str.data()) failed on line ",
                 0x38);
      goto LAB_0018f92e;
    }
    if (SStack_38.view_._M_len != 2) {
      iVar2 = 0x337;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.size() == 2) failed on line ",0x2f);
      goto LAB_0018f92e;
    }
    bVar1 = cm::String::is_stable(&SStack_38);
    if (!bVar1) {
      iVar2 = 0x338;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.is_stable()) failed on line ",0x2f);
      goto LAB_0018f92e;
    }
    psVar4 = cm::String::str_abi_cxx11_(&SStack_38);
    iVar2 = std::__cxx11::string::compare((char *)psVar4);
    if (iVar2 != 0) {
      iVar2 = 0x33b;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.str() == \"ab\") failed on line ",0x31);
      goto LAB_0018f92e;
    }
    bVar1 = cm::String::is_stable(&SStack_38);
    if (!bVar1) {
      iVar2 = 0x33c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.is_stable()) failed on line ",0x2f);
      goto LAB_0018f92e;
    }
    if (SStack_38.view_._M_str != pcVar5) {
      iVar2 = 0x33d;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.data() == substr_c) failed on line ",0x36
                );
      goto LAB_0018f92e;
    }
    if (SStack_38.view_._M_len != 2) {
      iVar2 = 0x33e;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.size() == 2) failed on line ",0x2f);
      goto LAB_0018f92e;
    }
    pcVar6 = cm::String::c_str(&SStack_38);
    if (pcVar6 != pcVar5) {
      iVar2 = 0x33f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.c_str() == substr_c) failed on line ",
                 0x37);
      goto LAB_0018f92e;
    }
    bVar1 = true;
  }
  else {
    iVar2 = 0x32f;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(substr.data() == str.data()) failed on line ",0x38
              );
LAB_0018f96f:
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
LAB_0018f991:
    bVar1 = false;
  }
  if (SStack_38.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (SStack_38.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (!bVar1) {
    return false;
  }
  cm::String::substr(&SStack_38,str,0,2);
  if (SStack_38.view_._M_str == (str->view_)._M_str) {
    if (SStack_38.view_._M_len != 2) {
      iVar2 = 0x345;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.size() == 2) failed on line ",0x2f);
      goto LAB_0018fce1;
    }
    bVar1 = cm::String::is_stable(&SStack_38);
    if (bVar1) {
      iVar2 = 0x346;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(!substr.is_stable()) failed on line ",0x30);
      goto LAB_0018fce1;
    }
    psVar4 = cm::String::str_abi_cxx11_(&SStack_38);
    iVar2 = std::__cxx11::string::compare((char *)psVar4);
    if (iVar2 != 0) {
      iVar2 = 0x349;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.str() == \"ab\") failed on line ",0x31);
      goto LAB_0018fce1;
    }
    bVar1 = cm::String::is_stable(&SStack_38);
    if (!bVar1) {
      iVar2 = 0x34a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.is_stable()) failed on line ",0x2f);
      goto LAB_0018fce1;
    }
    if (SStack_38.view_._M_str == (str->view_)._M_str) {
      iVar2 = 0x34b;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.data() != str.data()) failed on line ",
                 0x38);
      goto LAB_0018fce1;
    }
    if (SStack_38.view_._M_len != 2) {
      iVar2 = 0x34c;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.size() == 2) failed on line ",0x2f);
      goto LAB_0018fce1;
    }
    pcVar5 = cm::String::c_str(&SStack_38);
    if (pcVar5 == (str->view_)._M_str) {
      iVar2 = 0x34d;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(substr.c_str() != str.data()) failed on line ",
                 0x39);
      goto LAB_0018fce1;
    }
    pcVar5 = cm::String::c_str(&SStack_38);
    iVar2 = strcmp(pcVar5,"ab");
    if (iVar2 == 0) {
      if (pcVar5 == SStack_38.view_._M_str) {
        if (SStack_38.view_._M_len == 2) {
          bVar1 = cm::String::is_stable(&SStack_38);
          bVar7 = true;
          if (bVar1) goto LAB_0018fd05;
          iVar2 = 0x354;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ASSERT_TRUE(substr.is_stable()) failed on line ",0x2f);
        }
        else {
          iVar2 = 0x353;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ASSERT_TRUE(substr.size() == 2) failed on line ",0x2f);
        }
      }
      else {
        iVar2 = 0x352;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(substr_c == substr.data()) failed on line ",
                   0x36);
      }
    }
    else {
      iVar2 = 0x351;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(std::strcmp(substr_c, \"ab\") == 0) failed on line ",0x3d);
    }
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  else {
    iVar2 = 0x344;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(substr.data() == str.data()) failed on line ",0x38
              );
LAB_0018fce1:
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  bVar7 = false;
LAB_0018fd05:
  if (SStack_38.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (SStack_38.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar7;
}

Assistant:

static bool testMethod_substr_AtStart(cm::String str)
{
  {
    cm::String substr = str.substr(0, 2);
    ASSERT_TRUE(substr.data() == str.data());
    ASSERT_TRUE(substr.size() == 2);

    // c_str() not at the end of the buffer internally mutates.
    const char* substr_c = substr.c_str();
    ASSERT_TRUE(std::strcmp(substr_c, "ab") == 0);
    ASSERT_TRUE(substr_c != str.data());
    ASSERT_TRUE(substr.data() != str.data());
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(substr.is_stable());

    // str() does not need to internally mutate after c_str() did so
    ASSERT_TRUE(substr.str() == "ab");
    ASSERT_TRUE(substr.is_stable());
    ASSERT_TRUE(substr.data() == substr_c);
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(substr.c_str() == substr_c);
  }

  {
    cm::String substr = str.substr(0, 2);
    ASSERT_TRUE(substr.data() == str.data());
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(!substr.is_stable());

    // str() internally mutates.
    ASSERT_TRUE(substr.str() == "ab");
    ASSERT_TRUE(substr.is_stable());
    ASSERT_TRUE(substr.data() != str.data());
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(substr.c_str() != str.data());

    // c_str() does not internally after str() did so
    const char* substr_c = substr.c_str();
    ASSERT_TRUE(std::strcmp(substr_c, "ab") == 0);
    ASSERT_TRUE(substr_c == substr.data());
    ASSERT_TRUE(substr.size() == 2);
    ASSERT_TRUE(substr.is_stable());
  }

  return true;
}